

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<const_int_*,_bool> __thiscall
HighsHashTree<int,_void>::InnerLeaf<2>::insert_entry
          (InnerLeaf<2> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  HighsHashTableEntry<int,_void> *pHVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  unsigned_long *puVar8;
  undefined8 uVar9;
  ulong uVar10;
  pair<const_int_*,_bool> pVar11;
  int local_1c;
  
  uVar10 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  bVar2 = (byte)(uVar10 >> 10);
  uVar1 = (this->occupation).occupation;
  lVar3 = POPCOUNT(uVar1 >> (bVar2 & 0x3f));
  local_1c = (int)lVar3;
  if ((uVar1 >> (uVar10 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar1 | 1L << (bVar2 & 0x3f);
    if (local_1c < this->size) {
      iVar5 = local_1c + -1;
      puVar8 = (this->hashes)._M_elems + local_1c;
      do {
        iVar5 = iVar5 + 1;
        uVar1 = *puVar8;
        puVar8 = puVar8 + 1;
        local_1c = iVar5;
      } while ((uVar10 & 0xffff) < uVar1);
    }
  }
  else {
    do {
      lVar7 = lVar3;
      lVar3 = lVar7 + 1;
    } while ((uVar10 & 0xffff) < (this->hashes)._M_elems[lVar7 + -1]);
    lVar7 = lVar7 + -1;
    iVar6 = (int)lVar7;
    iVar5 = this->size;
    local_1c = iVar6;
    if (iVar5 + 2 != (int)lVar3) {
      do {
        local_1c = iVar6;
        if ((this->hashes)._M_elems[lVar3 + -2] != (uVar10 & 0xffff)) break;
        if (entry->value_ == (this->entries)._M_elems[lVar3 + -2].value_) {
          pHVar4 = (this->entries)._M_elems + iVar6;
          uVar9 = 0;
          goto LAB_00275223;
        }
        lVar7 = lVar7 + 1;
        lVar3 = lVar3 + 1;
        iVar6 = (int)lVar7;
        local_1c = iVar5;
      } while (iVar5 + 2 != (int)lVar3);
    }
  }
  if (local_1c < this->size) {
    move_backward(this,&local_1c,&this->size);
  }
  pHVar4 = (this->entries)._M_elems + local_1c;
  pHVar4->value_ = entry->value_;
  (this->hashes)._M_elems[local_1c] = uVar10 & 0xffff;
  iVar5 = this->size;
  lVar3 = (long)iVar5 + 1;
  this->size = (int)lVar3;
  (this->hashes)._M_elems[(long)iVar5 + 1] = 0;
  uVar9 = CONCAT71((int7)((ulong)lVar3 >> 8),1);
LAB_00275223:
  pVar11._8_8_ = uVar9;
  pVar11.first = &pHVar4->value_;
  return pVar11;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }